

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderPassCache.hpp
# Opt level: O0

bool __thiscall
Diligent::RenderPassCache::RenderPassCacheKey::operator==
          (RenderPassCacheKey *this,RenderPassCacheKey *rhs)

{
  size_t sVar1;
  size_t sVar2;
  uint local_24;
  Uint32 rt;
  RenderPassCacheKey *rhs_local;
  RenderPassCacheKey *this_local;
  
  sVar1 = GetHash(this);
  sVar2 = GetHash(rhs);
  if ((((sVar1 == sVar2) && (this->NumRenderTargets == rhs->NumRenderTargets)) &&
      (this->SampleCount == rhs->SampleCount)) &&
     ((((this->EnableVRS & 1U) == (rhs->EnableVRS & 1U) && (this->DSVFormat == rhs->DSVFormat)) &&
      ((this->ReadOnlyDSV & 1U) == (rhs->ReadOnlyDSV & 1U))))) {
    for (local_24 = 0; local_24 < this->NumRenderTargets; local_24 = local_24 + 1) {
      if (this->RTVFormats[local_24] != rhs->RTVFormats[local_24]) {
        return false;
      }
    }
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool operator==(const RenderPassCacheKey& rhs) const noexcept
        {
            // clang-format off
            if (GetHash()        != rhs.GetHash()        ||
                NumRenderTargets != rhs.NumRenderTargets ||
                SampleCount      != rhs.SampleCount      ||
                EnableVRS        != rhs.EnableVRS        ||
                DSVFormat        != rhs.DSVFormat        ||
                ReadOnlyDSV      != rhs.ReadOnlyDSV)
            {
                return false;
            }
            // clang-format on

            for (Uint32 rt = 0; rt < NumRenderTargets; ++rt)
                if (RTVFormats[rt] != rhs.RTVFormats[rt])
                    return false;

            return true;
        }